

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> * __thiscall
callback_data::calc_diff(callback_data *this)

{
  size_type sVar1;
  reference ppgVar2;
  ulong uVar3;
  long in_RSI;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RDI;
  float fVar4;
  ggml_tensor *in_stack_00000008;
  callback_data *in_stack_00000010;
  ggml_tensor *diff_filtered;
  size_t j;
  size_t n_elem;
  float *b;
  float *a;
  float il;
  undefined4 in_stack_ffffffffffffff98;
  float fVar5;
  float fVar6;
  ulong local_38;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_ffffffffffffffd8;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_ffffffffffffffe0;
  float local_14;
  
  local_14 = 0.0;
  while( true ) {
    fVar5 = local_14;
    sVar1 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size
                      ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(in_RSI + 0x18));
    fVar4 = (float)(long)sVar1;
    fVar6 = (float)sVar1;
    if (fVar6 <= fVar5) break;
    ppgVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(in_RSI + 0x18),
                         (long)local_14 | (long)(local_14 - 9.223372e+18) & (long)local_14 >> 0x3f);
    in_stack_ffffffffffffffe0 =
         (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(*ppgVar2)->data;
    ppgVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(in_RSI + 0x30),
                         (long)local_14 | (long)(local_14 - 9.223372e+18) & (long)local_14 >> 0x3f);
    in_stack_ffffffffffffffd8 =
         (vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(*ppgVar2)->data;
    ppgVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(in_RSI + 0x18),
                         (long)local_14 | (long)(local_14 - 9.223372e+18) & (long)local_14 >> 0x3f);
    uVar3 = ggml_nelements(*ppgVar2);
    for (local_38 = 0; local_38 < uVar3; local_38 = local_38 + 1) {
      *(float *)((long)&(in_stack_ffffffffffffffe0->
                        super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
                        super__Vector_impl_data._M_start + local_38 * 4) =
           *(float *)((long)&(in_stack_ffffffffffffffe0->
                             super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                             _M_impl.super__Vector_impl_data._M_start + local_38 * 4) -
           *(float *)((long)&(in_stack_ffffffffffffffd8->
                             super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>).
                             _M_impl.super__Vector_impl_data._M_start + local_38 * 4);
    }
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(in_RSI + 0x18),
               (long)local_14 | (long)(local_14 - 9.223372e+18) & (long)local_14 >> 0x3f);
    filter_nonzero_rows(in_stack_00000010,in_stack_00000008);
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::push_back
              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)CONCAT44(fVar6,fVar4),
               (value_type *)CONCAT44(fVar5,in_stack_ffffffffffffff98));
    local_14 = local_14 + 1.0;
  }
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

std::vector<struct ggml_tensor *> calc_diff() {
        for (float il = 0; il < v_pos.size(); il++) {
            float * a = (float *) v_pos[il]->data;
            float * b = (float *) v_neg[il]->data;
            size_t n_elem = ggml_nelements(v_pos[il]);
            for (size_t j = 0; j < n_elem; j++) {
                a[j] -= b[j];
            }
            //print_debug_tensor(v_pos[i]);
            auto diff_filtered = filter_nonzero_rows(v_pos[il]);
            v_diff_filtered.push_back(diff_filtered);
        }
        return v_diff_filtered; // for convinient, we return the result std::vector
    }